

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict sexp_fstat_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res1;
  sexp_conflict res;
  stat *tmp1;
  int err;
  int local_68;
  int local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  sexp_conflict local_40;
  stat *local_38;
  int local_2c;
  int *local_28;
  long local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_2c = 0;
  local_48 = 0x43e;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_58,0,0x10);
  if ((((ulong)local_28 & 1) == 1) || ((((ulong)local_28 & 3) == 0 && (*local_28 == 0xc)))) {
    local_58 = &local_48;
    local_50 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_58;
    local_38 = (stat *)calloc(1,0x91);
    if (((ulong)local_28 & 1) == 1) {
      auVar1._8_8_ = (long)local_28 >> 0x3f;
      auVar1._0_8_ = (ulong)local_28 & 0xfffffffffffffffe;
      local_60 = SUB164(auVar1 / SEXT816(2),0);
    }
    else {
      if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0xc)) {
        local_68 = (int)(char)local_28[2] * (int)*(undefined8 *)(local_28 + 6);
      }
      else {
        local_68 = 0;
      }
      local_60 = local_68;
    }
    local_2c = fstat(local_60,local_38);
    if (local_2c == 0) {
      auVar2._8_8_ = (long)*(ulong *)(local_18 + 0x38) >> 0x3f;
      auVar2._0_8_ = *(ulong *)(local_18 + 0x38) & 0xfffffffffffffffe;
      local_40 = (sexp_conflict)
                 sexp_make_cpointer(local_10,SUB168(auVar2 / SEXT816(2),0),local_38,0x3e,1);
    }
    else {
      local_40 = (sexp_conflict)0x3e;
    }
    *(undefined8 *)(local_10 + 0x6080) = local_50;
    local_8 = local_40;
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,2,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_fstat_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  struct stat* tmp1;
  sexp res;
  sexp_gc_var1(res1);
  if (! sexp_exact_integerp(arg0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg0);
  sexp_gc_preserve1(ctx, res1);
  tmp1 = (struct stat*) calloc(1, 1 + sizeof(tmp1[0]));
  err = fstat(sexp_sint_value(arg0), tmp1);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, SEXP_FALSE, 1);
  res = res1;
  }
  sexp_gc_release1(ctx);
  return res;
}